

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O0

void __thiscall tst_future::fail(tst_future *this)

{
  bool bVar1;
  QString local_e8;
  bool local_ca;
  bool local_c9;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *local_c8;
  QPromiseBase<QString> local_c0;
  QPromiseBase<void> local_b0;
  bool local_9a;
  bool local_99 [6];
  bool local_93;
  bool local_92 [2];
  undefined1 local_90 [8];
  Promise output;
  QString local_70;
  MyException local_58;
  undefined1 local_38 [8];
  QPromise<int> input;
  QString result;
  tst_future *this_local;
  
  QString::QString((QString *)&input.super_QPromiseBase<int>.m_d);
  QString::QString(&local_70,"bar");
  MyException::MyException(&local_58,&local_70);
  QtPromise::QPromiseBase<QString>::reject<MyException>((QPromiseBase<QString> *)local_38,&local_58)
  ;
  MyException::~MyException(&local_58);
  QString::~QString(&local_70);
  QtPromise::QPromiseBase<QString>::fail<tst_future::fail()::__0>
            ((QPromiseBase<QString> *)local_90,(anon_class_1_0_00000001 *)local_38);
  local_92[0] = QtPromise::QPromiseBase<QString>::isRejected((QPromiseBase<QString> *)local_38);
  local_93 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (local_92,&local_93,"input.isRejected()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x117);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_99[0] = QtPromise::QPromiseBase<QString>::isPending((QPromiseBase<QString> *)local_90);
    local_9a = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_99,&local_9a,"output.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x118);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_c8 = &input.super_QPromiseBase<int>.m_d;
      QtPromise::QPromiseBase<QString>::then<tst_future::fail()::__1>
                (&local_c0,(anon_class_8_1_6971b95b *)local_90);
      QtPromise::QPromiseBase<void>::wait(&local_b0,&local_c0);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_b0);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_c0);
      local_c9 = QtPromise::QPromiseBase<QString>::isFulfilled((QPromiseBase<QString> *)local_90);
      local_ca = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_c9,&local_ca,"output.isFulfilled()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x120);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        QString::QString(&local_e8,"foobar");
        bVar1 = QTest::qCompare((QString *)&input.super_QPromiseBase<int>.m_d,&local_e8,"result",
                                "QString{\"foobar\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                                ,0x121);
        QString::~QString(&local_e8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_99[1] = false;
          local_99[2] = false;
          local_99[3] = false;
          local_99[4] = false;
        }
        else {
          local_99[1] = true;
          local_99[2] = false;
          local_99[3] = false;
          local_99[4] = false;
        }
      }
      else {
        local_99[1] = true;
        local_99[2] = false;
        local_99[3] = false;
        local_99[4] = false;
      }
    }
    else {
      local_99[1] = true;
      local_99[2] = false;
      local_99[3] = false;
      local_99[4] = false;
    }
  }
  else {
    local_99[1] = true;
    local_99[2] = false;
    local_99[3] = false;
    local_99[4] = false;
  }
  QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_90);
  QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_38);
  QString::~QString((QString *)&input.super_QPromiseBase<int>.m_d);
  return;
}

Assistant:

void tst_future::fail()
{
    QString result;
    auto input = QtPromise::QPromise<QString>::reject(MyException{"bar"});
    auto output = input.fail([](const MyException& e) {
        return QtConcurrent::run(
            [](const QString& error) {
                return QString{"foo%1"}.arg(error);
            },
            e.error());
    });

    QCOMPARE(input.isRejected(), true);
    QCOMPARE(output.isPending(), true);

    output
        .then([&](const QString& res) {
            result = res;
        })
        .wait();

    QCOMPARE(output.isFulfilled(), true);
    QCOMPARE(result, QString{"foobar"});
}